

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_global.c
# Opt level: O0

int configRemove(mpt_config *cfg,mpt_path *path)

{
  mpt_metatype *pmVar1;
  mpt_node *pmVar2;
  mpt_metatype *mt;
  mpt_node *b;
  mpt_path p;
  mpt_configRoot *c;
  mpt_path *path_local;
  mpt_config *cfg_local;
  
  p._24_8_ = cfg + -1;
  mt = (mpt_metatype *)nodeGlobal;
  if (nodeGlobal == (mpt_node *)0x0) {
    return -4;
  }
  if (cfg[3]._vptr == (_mpt_vptr_config *)0x0) {
    if (path == (mpt_path *)0x0) {
      return -4;
    }
    if (path->len == 0) {
      clear_global();
      return 0;
    }
  }
  else {
    b = (mpt_node *)cfg[1]._vptr;
    p.base = (char *)cfg[2]._vptr;
    p.off = (size_t)cfg[3]._vptr;
    p.len = (size_t)cfg[4]._vptr;
    pmVar2 = mpt_node_query(nodeGlobal,(mpt_path *)&b);
    if ((pmVar2 == (mpt_node *)0x0) || (p.off != 0)) {
      return 0;
    }
    if (path == (mpt_path *)0x0) {
      pmVar1 = pmVar2->_meta;
      if (pmVar1 != (mpt_metatype *)0x0) {
        (*pmVar1->_vptr->unref)(pmVar1);
        pmVar2->_meta = (mpt_metatype *)0x0;
      }
      return 0;
    }
    if (path->len == 0) {
      mpt_node_clear(pmVar2);
      return 0;
    }
    mt = (mpt_metatype *)pmVar2->children;
  }
  b = (mpt_node *)path->base;
  p.base = (char *)path->off;
  p.off = path->len;
  p.len._0_1_ = path->first;
  p.len._1_1_ = path->flags;
  p.len._2_1_ = path->sep;
  p.len._3_1_ = path->assign;
  p.len._4_4_ = *(undefined4 *)&path->field_0x1c;
  pmVar2 = mpt_node_query((mpt_node *)mt,(mpt_path *)&b);
  if ((pmVar2 == (mpt_node *)0x0) || (p.off != 0)) {
    cfg_local._4_4_ = 0;
  }
  else {
    if (pmVar2 == nodeGlobal) {
      nodeGlobal = pmVar2->next;
      pmVar2->next = (mpt_node *)0x0;
    }
    else {
      mpt_node_unlink(pmVar2);
    }
    mpt_node_destroy(pmVar2);
    cfg_local._4_4_ = 1;
  }
  return cfg_local._4_4_;
}

Assistant:

static int configRemove(MPT_INTERFACE(config) *cfg, const MPT_STRUCT(path) *path)
{
	MPT_STRUCT(configRoot) *c = MPT_baseaddr(configRoot, cfg, _cfg);
	MPT_STRUCT(path) p;
	MPT_STRUCT(node) *b;
	
	if (!(b = nodeGlobal)) {
		return MPT_ERROR(BadOperation);
	}
	/* get top level node */
	if (c->base.len) {
		p = c->base;
		if (!(b = mpt_node_query(b, &p))
		    || p.len) {
			return 0;
		}
		if (!path) {
			MPT_INTERFACE(metatype) *mt;
			if ((mt = b->_meta)) {
				mt->_vptr->unref(mt);
				b->_meta = 0;
			}
			return 0;
		}
		if (!path->len) {
			mpt_node_clear(b);
			return 0;
		}
		b = b->children;
	}
	/* no generic top element */
	else if (!path) {
		return MPT_ERROR(BadOperation);
	}
	/* clear global config */
	else if (!path->len) {
		clear_global();
		return 0;
	}
	p = *path;
	if (!(b = mpt_node_query(b, &p))
	    || p.len) {
		return 0;
	}
	if (b == nodeGlobal) {
		nodeGlobal = b->next;
		b->next = 0;
	} else {
		mpt_node_unlink(b);
	}
	mpt_node_destroy(b);
	return 1;
}